

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

void __thiscall
slang::IntervalMapDetails::
NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Compilation::NetAlias_*,_8U>
::transferToRightSib
          (NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Compilation::NetAlias_*,_8U>
           *this,uint32_t size,
          NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Compilation::NetAlias_*,_8U>
          *sib,uint32_t sibSize,uint32_t count)

{
  uint uVar1;
  unsigned_long *puVar2;
  unsigned_long uVar3;
  int iVar4;
  long lVar5;
  
  if (sibSize != 0) {
    lVar5 = (ulong)(sibSize - 1) << 3;
    do {
      uVar1 = (count - 1) + sibSize;
      puVar2 = (unsigned_long *)((long)&sib->first[0].left + lVar5 * 2);
      uVar3 = puVar2[1];
      sib->first[uVar1].left = *puVar2;
      sib->first[uVar1].right = uVar3;
      sib->second[uVar1] = *(NetAlias **)((long)sib->second + lVar5);
      lVar5 = lVar5 + -8;
      sibSize = sibSize - 1;
    } while (sibSize != 0);
  }
  if (count != 0) {
    iVar4 = -count;
    lVar5 = 0;
    do {
      uVar3 = this->first[size + iVar4].right;
      puVar2 = (unsigned_long *)((long)&sib->first[0].left + lVar5 * 2);
      *puVar2 = this->first[size + iVar4].left;
      puVar2[1] = uVar3;
      *(NetAlias **)((long)sib->second + lVar5) = this->second[size + iVar4];
      lVar5 = lVar5 + 8;
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

void transferToRightSib(uint32_t size, NodeBase& sib, uint32_t sibSize, uint32_t count) {
        sib.moveRight(0, count, sibSize);
        sib.copy(*this, size - count, 0, count);
    }